

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Storyboard.cpp
# Opt level: O0

Storyboard * __thiscall
ApprovalTests::Storyboard::addFrames
          (Storyboard *this,int numberOfFrames,
          function<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(int)>
          *function)

{
  int in_ESI;
  Storyboard *in_RDI;
  string *in_stack_00000030;
  Storyboard *in_stack_00000038;
  int frame;
  int in_stack_ffffffffffffffb4;
  function<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(int)>
  *in_stack_ffffffffffffffb8;
  string local_40 [36];
  int local_1c;
  int local_c;
  
  local_c = in_ESI;
  for (local_1c = 1; local_1c <= local_c; local_1c = local_1c + 1) {
    ::std::
    function<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(int)>
    ::operator()(in_stack_ffffffffffffffb8,in_stack_ffffffffffffffb4);
    addFrame(in_stack_00000038,in_stack_00000030);
    ::std::__cxx11::string::~string(local_40);
  }
  return in_RDI;
}

Assistant:

Storyboard& Storyboard::addFrames(int numberOfFrames,
                                      const std::function<std::string(int)>& function)
    {
        for (int frame = 1; frame <= numberOfFrames; ++frame)
        {
            addFrame(function(frame));
        }
        return *this;
    }